

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O0

QPlatformNativeInterface * __thiscall
QOffscreenIntegration::nativeInterface(QOffscreenIntegration *this)

{
  bool bVar1;
  QOffscreenPlatformNativeInterface *this_00;
  QPlatformNativeInterface *pQVar2;
  long in_RDI;
  QOffscreenIntegration *in_stack_ffffffffffffffd8;
  
  bVar1 = QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
          ::operator!((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
                       *)(in_RDI + 0x28));
  if (bVar1) {
    this_00 = (QOffscreenPlatformNativeInterface *)(in_RDI + 0x28);
    pQVar2 = (QPlatformNativeInterface *)operator_new(0x18);
    QOffscreenPlatformNativeInterface::QOffscreenPlatformNativeInterface
              (this_00,in_stack_ffffffffffffffd8);
    QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>::
    reset((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
           *)this_00,pQVar2);
  }
  pQVar2 = QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
           ::get((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
                  *)(in_RDI + 0x28));
  return pQVar2;
}

Assistant:

QPlatformNativeInterface *QOffscreenIntegration::nativeInterface() const
{
    if (!m_nativeInterface)
        m_nativeInterface.reset(new QOffscreenPlatformNativeInterface(const_cast<QOffscreenIntegration*>(this)));
    return m_nativeInterface.get();
}